

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::CallOrCast::CallOrCast
          (CallOrCast *this,Expression *nameOrTargetType,
          pool_ptr<soul::AST::CommaSeparatedList> *args,bool isMethod)

{
  pool_ptr<soul::AST::CommaSeparatedList> local_30;
  undefined1 local_21;
  pool_ptr<soul::AST::CommaSeparatedList> *ppStack_20;
  bool isMethod_local;
  pool_ptr<soul::AST::CommaSeparatedList> *args_local;
  Expression *nameOrTargetType_local;
  CallOrCast *this_local;
  
  local_30 = (pool_ptr<soul::AST::CommaSeparatedList>)args->object;
  local_21 = isMethod;
  ppStack_20 = args;
  args_local = (pool_ptr<soul::AST::CommaSeparatedList> *)nameOrTargetType;
  nameOrTargetType_local = (Expression *)this;
  CallOrCastBase::CallOrCastBase
            (&this->super_CallOrCastBase,CallOrCast,
             &(nameOrTargetType->super_Statement).super_ASTObject.context,&local_30,isMethod);
  pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_30);
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__CallOrCast_00586340;
  pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>
            (&this->nameOrType,(Expression *)args_local);
  return;
}

Assistant:

CallOrCast (Expression& nameOrTargetType, pool_ptr<CommaSeparatedList> args, bool isMethod)
            : CallOrCastBase (ObjectType::CallOrCast, nameOrTargetType.context, args, isMethod), nameOrType (nameOrTargetType)
        {
        }